

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNot virtual_or_not,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  cpp *pcVar2;
  long lVar3;
  long lVar4;
  anon_class_1_0_00000001 local_4f9;
  Sub *local_4f8;
  Sub *local_4f0;
  Sub *local_4e8;
  Options *local_4e0;
  string local_4d8;
  string local_4b8;
  string local_498;
  undefined1 local_478 [32];
  string local_458;
  char *local_438 [2];
  Printer *local_428;
  long local_420;
  char *local_418;
  undefined1 local_410 [8];
  string local_408;
  string local_3e8;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  pSVar1 = this->descriptor_;
  if (0 < *(int *)(pSVar1 + 0x38)) {
    local_4e8 = &local_310;
    local_4f0 = &local_258;
    local_4f8 = &local_1a0;
    local_438[0] = "";
    local_438[1] = "";
    if (virtual_or_not == kVirtual) {
      local_438[1] = "virtual";
    }
    else {
      local_438[0] = "override";
    }
    local_420 = 0;
    local_4e0 = (Options *)this;
    local_428 = printer;
    do {
      lVar3 = *(long *)(pSVar1 + 0x30);
      lVar4 = local_420 * 0x50;
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"name","");
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_3c8,&local_458,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar3 + 8 + lVar4));
      local_478._0_8_ = local_478 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"input","");
      pcVar2 = (cpp *)google::protobuf::MethodDescriptor::input_type();
      QualifiedClassName_abi_cxx11_(&local_3e8,pcVar2,(Descriptor *)local_4e0->split_map,local_4e0);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,(string *)local_478,&local_3e8);
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"output","");
      pcVar2 = (cpp *)google::protobuf::MethodDescriptor::output_type();
      QualifiedClassName_abi_cxx11_(&local_408,pcVar2,(Descriptor *)local_4e0->split_map,local_4e0);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_4d8,&local_408);
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"virtual","");
      local_410 = (undefined1  [8])local_438[1];
      io::Printer::Sub::Sub<char_const*>(&local_1a0,&local_498,(char **)local_410);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"override","");
      local_418 = local_438[0];
      io::Printer::Sub::Sub<char_const*>(&local_e8,&local_4b8,&local_418);
      google::protobuf::io::Printer::Emit
                (local_428,&local_3c8,5,0x10d,
                 "\n          $virtual $void $name$(::$proto_ns$::RpcController* controller,\n                                const $input$* request,\n                                $output$* response,\n                                ::google::protobuf::Closure* done)$ override$;\n        "
                );
      lVar3 = 0x398;
      do {
        if (local_3e8.field_2._M_local_buf[lVar3 + 8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_410 + lVar3));
        }
        if ((long *)((long)&local_428 + lVar3) != *(long **)((long)local_438 + lVar3)) {
          operator_delete(*(long **)((long)local_438 + lVar3),
                          *(long *)((long)&local_428 + lVar3) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[*(byte *)((long)local_438 + lVar3 + -8)]._M_data)
                  (&local_4f9,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_478 + lVar3 + 0x18));
        *(undefined1 *)((long)local_438 + lVar3 + -8) = 0xff;
        if ((long *)(local_478 + lVar3 + 8) != *(long **)(local_478 + lVar3 + -8)) {
          operator_delete(*(long **)(local_478 + lVar3 + -8),*(long *)(local_478 + lVar3 + 8) + 1);
        }
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      local_420 = local_420 + 1;
      pSVar1 = (ServiceDescriptor *)local_4e0->access_info_map;
    } while (local_420 < *(int *)(pSVar1 + 0x38));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNot virtual_or_not,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"virtual", virtual_or_not == kVirtual ? "virtual" : ""},
            {"override", virtual_or_not != kVirtual ? "override" : ""},
        },
        // No cc, clang-format does not format this string well due to the
        // $ override$ substitution.
        R"(
          $virtual $void $name$(::$proto_ns$::RpcController* controller,
                                const $input$* request,
                                $output$* response,
                                ::google::protobuf::Closure* done)$ override$;
        )");
  }
}